

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring_array.c
# Opt level: O1

void ra_append_copies_after
               (roaring_array_t *ra,roaring_array_t *sa,uint16_t before_start,_Bool copy_on_write)

{
  ushort uVar1;
  int end_index;
  bool bVar2;
  uint uVar3;
  uint in_R9D;
  uint uVar4;
  int iVar5;
  
  end_index = sa->size;
  if (((long)end_index == 0) || (sa->keys[(long)end_index + -1] == before_start)) {
    uVar4 = end_index - 1;
  }
  else {
    iVar5 = end_index + -1;
    uVar3 = 0;
    do {
      if (iVar5 < (int)uVar3) {
        uVar4 = ~uVar3;
        break;
      }
      uVar4 = uVar3 + iVar5 >> 1;
      uVar1 = *(ushort *)((long)sa->keys + (ulong)(uVar3 + iVar5 & 0xfffffffe));
      if (uVar1 < before_start) {
        uVar3 = uVar4 + 1;
        bVar2 = true;
        uVar4 = in_R9D;
      }
      else if (before_start < uVar1) {
        iVar5 = uVar4 - 1;
        bVar2 = true;
        uVar4 = in_R9D;
      }
      else {
        bVar2 = false;
      }
      in_R9D = uVar4;
    } while (bVar2);
  }
  uVar3 = ~uVar4;
  if (-1 < (int)uVar4) {
    uVar3 = uVar4 + 1;
  }
  ra_append_copy_range(ra,sa,uVar3,end_index,copy_on_write);
  return;
}

Assistant:

void ra_append_copies_after(roaring_array_t *ra, const roaring_array_t *sa,
                            uint16_t before_start, bool copy_on_write) {
    int start_location = ra_get_index(sa, before_start);
    if (start_location >= 0)
        ++start_location;
    else
        start_location = -start_location - 1;
    ra_append_copy_range(ra, sa, start_location, sa->size, copy_on_write);
}